

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

void __thiscall ParseOperation::ParseOperation(ParseOperation *this,Production *reduceProduction)

{
  bool bVar1;
  string *__lhs;
  Production *reduceProduction_local;
  ParseOperation *this_local;
  
  this->reduceProduction = reduceProduction;
  this->newState = (GLRState *)0x0;
  __lhs = Production::getFromP_abi_cxx11_(reduceProduction);
  bVar1 = std::operator==(__lhs,"accept");
  if (bVar1) {
    this->operationType = accept;
  }
  else {
    this->operationType = reduce;
  }
  return;
}

Assistant:

ParseOperation::ParseOperation(Production *reduceProduction) : reduceProduction(
        reduceProduction) {
    if (reduceProduction->getFromP() == "accept") {
        operationType = accept;
    } else {
        operationType = reduce;
    }
}